

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

int __thiscall gmlc::networking::TcpServer::close(TcpServer *this,int __fd)

{
  bool bVar1;
  int extraout_EAX;
  size_type sVar2;
  element_type *peVar3;
  int iVar4;
  size_type ii_1;
  size_type ii;
  size_type sz;
  unique_lock<std::mutex> lock;
  shared_ptr<gmlc::networking::TcpAcceptor> *acc_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *__range4_1;
  shared_ptr<gmlc::networking::TcpAcceptor> *acc;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *__range4;
  TcpConnection *in_stack_00000090;
  TcpConnection *in_stack_000001b0;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
  *in_stack_ffffffffffffff70;
  unique_lock<std::mutex> *this_00;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *in_stack_ffffffffffffff80;
  size_type __n;
  size_type local_78;
  unique_lock<std::mutex> local_58;
  reference local_48;
  shared_ptr<gmlc::networking::TcpAcceptor> *local_40;
  __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
  local_38;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *local_30;
  reference local_28;
  shared_ptr<gmlc::networking::TcpAcceptor> *local_20;
  __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
  local_18;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *local_10;
  TcpServer *local_8;
  
  local_8 = this;
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  sVar2 = std::
          vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
          ::size(&this->acceptors);
  if (sVar2 == 1) {
    iVar4 = 0;
    std::
    vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
    ::operator[](&this->acceptors,0);
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7cdc8b);
    TcpAcceptor::close(peVar3,iVar4);
  }
  else {
    bVar1 = std::
            vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
            ::empty(in_stack_ffffffffffffff80);
    if (!bVar1) {
      local_10 = &this->acceptors;
      local_18._M_current =
           (shared_ptr<gmlc::networking::TcpAcceptor> *)
           std::
           vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           ::begin((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      local_20 = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                 std::
                 vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                 ::end((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      while (bVar1 = __gnu_cxx::
                     operator==<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                               (in_stack_ffffffffffffff70,
                                (__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        local_28 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                   ::operator*(&local_18);
        std::
        __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x7cdd1c);
        TcpAcceptor::cancel((TcpAcceptor *)0x7cdd24);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
        ::operator++(&local_18);
      }
      local_30 = &this->acceptors;
      local_38._M_current =
           (shared_ptr<gmlc::networking::TcpAcceptor> *)
           std::
           vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           ::begin((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      local_40 = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                 std::
                 vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                 ::end((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      while( true ) {
        iVar4 = (int)&local_40;
        bVar1 = __gnu_cxx::
                operator==<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                          (in_stack_ffffffffffffff70,
                           (__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_48 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                   ::operator*(&local_38);
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x7cdd8f);
        TcpAcceptor::close(peVar3,iVar4);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
        ::operator++(&local_38);
      }
      std::
      vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
      ::clear((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
               *)0x7cddb1);
    }
  }
  this_00 = &local_58;
  std::unique_lock<std::mutex>::unique_lock
            (this_00,(mutex_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  sVar2 = std::
          vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
          ::size(&this->connections);
  std::unique_lock<std::mutex>::unlock(this_00);
  if (sVar2 != 0) {
    for (local_78 = 0; local_78 < sVar2; local_78 = local_78 + 1) {
      std::
      vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
      ::operator[](&this->connections,local_78);
      CLI::std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x7cde2c);
      TcpConnection::closeNoWait(in_stack_00000090);
    }
    for (__n = 0; __n < sVar2; __n = __n + 1) {
      std::
      vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
      ::operator[](&this->connections,__n);
      CLI::std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x7cde95);
      TcpConnection::waitOnClose(in_stack_000001b0);
    }
    std::
    vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
    ::clear((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
             *)0x7cdec2);
  }
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return extraout_EAX;
}

Assistant:

void TcpServer::close()
{
    halted = true;
    if (acceptors.size() == 1) {
        acceptors[0]->close();
    } else if (!acceptors.empty()) {
        // cancel first to give the threads some time to process
        for (auto& acc : acceptors) {
            acc->cancel();
        }
        for (auto& acc : acceptors) {
            acc->close();
        }
        acceptors.clear();
    }

    std::unique_lock<std::mutex> lock(accepting);
    auto sz = connections.size();
    lock.unlock();
    if (sz > 0) {
        for (decltype(sz) ii = 0; ii < sz; ++ii) {
            connections[ii]->closeNoWait();
        }
        for (decltype(sz) ii = 0; ii < sz; ++ii) {
            connections[ii]->waitOnClose();
        }
        connections.clear();
    }
}